

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O2

void __thiscall
duckdb::TemporaryFileHandle::RemoveTempBlockIndex
          (TemporaryFileHandle *this,TemporaryFileLock *param_1,idx_t index)

{
  idx_t iVar1;
  bool bVar2;
  FileSystem *pFVar3;
  type pFVar4;
  long lVar5;
  
  bVar2 = BlockIndexManager::RemoveIndex(&this->index_manager,index,(this->identifier).size);
  if (bVar2) {
    iVar1 = (this->index_manager).max_index;
    pFVar3 = FileSystem::GetFileSystem(this->db);
    pFVar4 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator*(&this->handle);
    lVar5 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                      ((iVar1 + 1) * (this->identifier).size);
    (*pFVar3->_vptr_FileSystem[0xc])(pFVar3,pFVar4,lVar5,pFVar3->_vptr_FileSystem[0xc]);
    return;
  }
  return;
}

Assistant:

void TemporaryFileHandle::RemoveTempBlockIndex(TemporaryFileLock &, idx_t index) {
	// remove the block index from the index manager
	if (index_manager.RemoveIndex(index, identifier.size)) {
		// the max_index that is currently in use has decreased
		// as a result we can truncate the file
#ifndef WIN32 // this ended up causing issues when sorting
		auto max_index = index_manager.GetMaxIndex();
		auto &fs = FileSystem::GetFileSystem(db);
		fs.Truncate(*handle, NumericCast<int64_t>(GetPositionInFile(max_index + 1)));
#endif
	}
}